

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall r_comp::Compiler::is_object(Compiler *this,Ptr *node,Class *p)

{
  __type _Var1;
  element_type *peVar2;
  Class *p_local;
  Ptr *node_local;
  Compiler *this_local;
  
  peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  _Var1 = std::operator==(&peVar2->cmd,&p->str_opcode);
  return _Var1;
}

Assistant:

bool Compiler::is_object(RepliStruct::Ptr node, const Class &p)
{
    return (node->cmd == p.str_opcode);
}